

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamMultiReader_p.cpp
# Opt level: O0

bool __thiscall BamTools::Internal::BamMultiReaderPrivate::Close(BamMultiReaderPrivate *this)

{
  bool bVar1;
  RuleToken *in_RDI;
  BamMultiReaderPrivate *unaff_retaddr;
  string message;
  string currentError;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  allocator local_c1;
  string local_c0 [39];
  allocator<char> local_99;
  string local_98 [24];
  string *in_stack_ffffffffffffff80;
  BamMultiReaderPrivate *in_stack_ffffffffffffff88;
  BamMultiReaderPrivate *in_stack_ffffffffffffff90;
  string local_58 [48];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_28;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  byte bVar2;
  
  std::__cxx11::string::clear();
  this_00 = &local_28;
  Filenames_abi_cxx11_(in_stack_ffffffffffffff88);
  bVar1 = CloseFiles(unaff_retaddr,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(this_00);
  if (bVar1) {
    bVar2 = 1;
  }
  else {
    std::__cxx11::string::string(local_58,(string *)(in_RDI + 1));
    __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_99;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_98,"error encountered while closing all files: \n\t",(allocator *)__rhs);
    std::operator+(in_RDI,__rhs);
    std::__cxx11::string::~string(local_98);
    std::allocator<char>::~allocator(&local_99);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_c0,"BamMultiReader::Close",&local_c1);
    SetErrorString(in_stack_ffffffffffffff90,(string *)in_stack_ffffffffffffff88,
                   in_stack_ffffffffffffff80);
    std::__cxx11::string::~string(local_c0);
    std::allocator<char>::~allocator((allocator<char> *)&local_c1);
    bVar2 = 0;
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff88);
    std::__cxx11::string::~string(local_58);
  }
  return (bool)(bVar2 & 1);
}

Assistant:

bool BamMultiReaderPrivate::Close()
{

    m_errorString.clear();

    if (CloseFiles(Filenames())) {
        return true;
    } else {
        const std::string currentError = m_errorString;
        const std::string message =
            std::string("error encountered while closing all files: \n\t") + currentError;
        SetErrorString("BamMultiReader::Close", message);
        return false;
    }
}